

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O2

copy_ptr<cppcms::http::cookie::_data> * __thiscall
booster::copy_ptr<cppcms::http::cookie::_data>::operator=
          (copy_ptr<cppcms::http::cookie::_data> *this,copy_ptr<cppcms::http::cookie::_data> *other)

{
  _data *p_Var1;
  _data *in_RAX;
  copy_ptr<cppcms::http::cookie::_data> tmp;
  copy_ptr<cppcms::http::cookie::_data> local_18;
  
  if (this != other) {
    local_18.ptr_ = in_RAX;
    copy_ptr(&local_18,other);
    p_Var1 = this->ptr_;
    this->ptr_ = (_data *)local_18;
    local_18.ptr_ = p_Var1;
    ~copy_ptr(&local_18);
  }
  return this;
}

Assistant:

copy_ptr const &operator=(copy_ptr const &other)
		{
			if(this != &other) {
				copy_ptr tmp(other);
				swap(tmp);
			}
			return *this;
		}